

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t cfd::core::TxIn::EstimateTxInVsize
                   (AddressType addr_type,Script *redeem_script,Script *scriptsig_template)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  uint32_t local_68;
  uint32_t local_64;
  Script local_60;
  
  local_64 = 0;
  local_68 = 0;
  Script::Script(&local_60,redeem_script);
  EstimateTxInSize(addr_type,&local_60,&local_64,&local_68,scriptsig_template);
  Script::~Script(&local_60);
  uVar1 = AbstractTransaction::GetVsizeFromSize(local_68,local_64);
  return uVar1;
}

Assistant:

uint32_t TxIn::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script,
    const Script *scriptsig_template) {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  TxIn::EstimateTxInSize(
      addr_type, redeem_script, &witness_size, &no_witness_size,
      scriptsig_template);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}